

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O3

sexp sexp_bignum_normalize(sexp a)

{
  ulong uVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  long lVar4;
  
  if ((((ulong)a & 3) == 0) && (a->tag == 0xc)) {
    puVar2 = (undefined1 *)((long)&((a->value).type.cpl)->tag + 2);
    do {
      puVar3 = puVar2;
      if (puVar3 == (undefined1 *)0x3) goto LAB_00118c4d;
      puVar2 = puVar3 + -1;
    } while (*(long *)(&a->tag + (long)puVar3 * 2) == 0);
    if (puVar3 + -2 < (undefined1 *)0x2) {
LAB_00118c4d:
      uVar1 = (a->value).string.length;
      lVar4 = (long)(a->value).flonum_bits[0];
      if ((uVar1 >> 0x3e == 0) ||
         (lVar4 = -1, uVar1 == 0x4000000000000000 && (a->value).flonum_bits[0] == -1)) {
        return (sexp)(uVar1 * lVar4 * 2 + 1);
      }
    }
  }
  return a;
}

Assistant:

sexp sexp_bignum_normalize (sexp a) {
  sexp_uint_t *data;
  if ((! sexp_bignump(a)) || (sexp_bignum_hi(a)>1))
    return a;
  data = sexp_bignum_data(a);
  if ((data[0] > SEXP_MAX_FIXNUM)
      && ! ((sexp_bignum_sign(a) == -1) && (data[0] == SEXP_MAX_FIXNUM+1)))
    return a;
  return sexp_make_fixnum((sexp_sint_t)data[0] * sexp_bignum_sign(a));
}